

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_cleanup_multiple_channels(APITests *this)

{
  byte bVar1;
  runtime_error *this_00;
  Warning *in_RDI;
  Warning w;
  Warning *in_stack_fffffffffffffdf8;
  string local_1e0 [16];
  Warning *in_stack_fffffffffffffe30;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 *local_1b8;
  undefined8 local_1b0;
  
  GPIO::setwarnings(false);
  Warning::Warning(in_stack_fffffffffffffe30);
  GPIO::setmode(BOARD);
  GPIO::setup(*(int *)&in_RDI->field_0x24,IN,-1);
  GPIO::setup(*(int *)&in_RDI->field_0x2c,IN,-1);
  GPIO::setup(*(int *)&in_RDI->field_0x20,OUT,-1);
  local_1c0 = *(undefined4 *)&in_RDI->field_0x24;
  local_1bc = *(undefined4 *)&in_RDI->field_0x2c;
  local_1b8 = &local_1c0;
  local_1b0 = 2;
  GPIO::cleanup((initializer_list *)&local_1b8);
  Warning::contents_abi_cxx11_(in_stack_fffffffffffffdf8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_1e0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    GPIO::cleanup();
    Warning::~Warning(in_RDI);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected warning occured");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_cleanup_multiple_channels()
    {
        GPIO::setwarnings(false);
        Warning w{};

        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::setup(pin_data.in_b, GPIO::IN);
        GPIO::setup(pin_data.out_a, GPIO::OUT);

        GPIO::cleanup({pin_data.in_a, pin_data.in_b});

        if (!w.contents().empty())
            throw std::runtime_error("Unexpected warning occured");

        GPIO::cleanup();
    }